

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O2

void __thiscall
duckdb::Logger::
WriteLog<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
          (Logger *this,char *log_type,LogLevel log_level,char *format_string,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2,
          unsigned_long params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          unsigned_long params_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  undefined1 in_stack_ffffffffffffff08 [24];
  unsigned_long in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88 [32];
  string formatted_string;
  string local_48 [32];
  
  ::std::__cxx11::string::string(local_88,format_string,(allocator *)&stack0xffffffffffffff17);
  ::std::__cxx11::string::string((string *)&local_a8,(string *)params);
  ::std::__cxx11::string::string((string *)&local_c8,(string *)params_1);
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff18,(string *)params_2._M_dataplus._M_p);
  ::std::__cxx11::string::string(local_48,(string *)params_2.field_2._M_allocated_capacity);
  params_4_00._M_string_length = in_stack_ffffffffffffff08._0_8_;
  params_4_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff08._8_16_;
  params_4_00._M_dataplus._M_p = (pointer)params_2.field_2._8_8_;
  StringUtil::
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long,std::__cxx11::string,unsigned_long>
            (&formatted_string,(StringUtil *)local_88,&local_a8,&local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             params_2._M_string_length,(unsigned_long)local_48,params_4_00,in_stack_ffffffffffffff20
            );
  ::std::__cxx11::string::~string(local_48);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string(local_88);
  (*this->_vptr_Logger[3])(this,log_type,(ulong)log_level,formatted_string._M_dataplus._M_p);
  ::std::__cxx11::string::~string((string *)&formatted_string);
  return;
}

Assistant:

void WriteLog(const char *log_type, LogLevel log_level, const char *format_string, ARGS... params) {
		auto formatted_string = StringUtil::Format(format_string, params...);
		WriteLog(log_type, log_level, formatted_string.c_str());
	}